

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.cpp
# Opt level: O3

void DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_15(void)

{
  code *pcVar1;
  char extraout_AL;
  double __x;
  pair<char,_double> p;
  ResultBuilder DOCTEST_RB;
  char local_e5;
  ExpressionDecomposer local_e4;
  Result local_e0;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  undefined1 *local_b0;
  Enum local_a8;
  ResultBuilder local_a0;
  
  local_c0[0] = 99;
  local_b8 = 0x40091eb851eb851f;
  doctest::String::String((String *)&local_e0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/test/burst/tuple/get.cpp"
             ,0x3f,"burst::get<0>(p) == \'c\'","",(String *)&local_e0);
  doctest::String::~String((String *)&local_e0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_e4,DT_CHECK);
  local_b0 = local_c0;
  local_a8 = local_e4.m_at;
  local_e5 = 'c';
  doctest::detail::Expression_lhs<char_const&>::operator==
            (&local_e0,(Expression_lhs<char_const&> *)&local_b0,&local_e5);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_e0);
  doctest::String::~String(&local_e0.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  return;
}

Assistant:

movable (const movable &):
            initialized_by{initialization_way::copy}
        {
        }